

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O1

void __thiscall minibag::Bag::stopWritingChunk(Bag *this)

{
  ChunkedFile *this_00;
  element_type *peVar1;
  uint32_t uncompressed_size;
  uint32_t compressed_size;
  uint64_t uVar2;
  
  std::vector<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>::push_back
            (&this->chunks_,&this->curr_chunk_info_);
  uncompressed_size = getChunkOffset(this);
  this_00 = &this->file_;
  ChunkedFile::setWriteMode(this_00,Uncompressed);
  uVar2 = ChunkedFile::getOffset(this_00);
  peVar1 = (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  compressed_size =
       (*peVar1->_vptr_EncryptorBase[3])
                 (peVar1,(ulong)(uint)((int)uVar2 - (int)this->curr_chunk_data_pos_),
                  this->curr_chunk_data_pos_,this_00);
  uVar2 = ChunkedFile::getOffset(this_00);
  ChunkedFile::seek(this_00,(this->curr_chunk_info_).pos,0);
  writeChunkHeader(this,this->compression_,compressed_size,uncompressed_size);
  ChunkedFile::seek(this_00,uVar2,0);
  writeIndexRecords(this);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
  ::clear(&(this->curr_chunk_connection_indexes_)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::clear(&(this->curr_chunk_info_).connection_counts._M_t);
  this->chunk_open_ = false;
  return;
}

Assistant:

void Bag::stopWritingChunk() {
    // Add this chunk to the index
    chunks_.push_back(curr_chunk_info_);
    
    // Get the uncompressed and compressed sizes
    uint32_t uncompressed_size = getChunkOffset();
    file_.setWriteMode(compression::Uncompressed);
    uint32_t compressed_size = file_.getOffset() - curr_chunk_data_pos_;

    // When encryption is on, compressed_size represents encrypted chunk size;
    // When decrypting, the actual compressed size can be deduced from the decrypted chunk
    compressed_size = encryptor_->encryptChunk(compressed_size, curr_chunk_data_pos_, file_);

    // Rewrite the chunk header with the size of the chunk (remembering current offset)
    uint64_t end_of_chunk_pos = file_.getOffset();

    seek(curr_chunk_info_.pos);
    writeChunkHeader(compression_, compressed_size, uncompressed_size);

    // Write out the indexes and clear them
    seek(end_of_chunk_pos);
    writeIndexRecords();
    curr_chunk_connection_indexes_.clear();

    // Clear the connection counts
    curr_chunk_info_.connection_counts.clear();
    
    // Flag that we're starting a new chunk
    chunk_open_ = false;
}